

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxPtrs.h
# Opt level: O0

void Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>::AllocAuxPtrFix
               (FunctionProxy *host,uint8 size)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *pAVar5;
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> **ppAVar6;
  TrackAllocData local_80;
  code *local_58;
  undefined8 local_50;
  TrackAllocData local_48;
  Recycler *local_20;
  Recycler *recycler;
  FunctionProxy *pFStack_10;
  uint8 size_local;
  FunctionProxy *host_local;
  
  recycler._7_1_ = size;
  pFStack_10 = host;
  local_20 = FunctionProxy::GetRecycler(host);
  if (local_20 == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/AuxPtrs.h"
                                ,0xab,"(recycler != nullptr)","recycler != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pRVar4 = local_20;
  if (recycler._7_1_ == '\x10') {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,
               (type_info *)
               &AuxPtrsFix<Js::FunctionProxy::AuxPointerType,(unsigned_char)16,(unsigned_char)1>::
                typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/AuxPtrs.h"
               ,0xaf);
    pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_48);
    local_58 = Memory::Recycler::AllocZeroWithBarrier;
    local_50 = 0;
    pAVar5 = (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)
             new<Memory::Recycler>(0x10,pRVar4,0x74bdc0);
    AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)'\x10',_(unsigned_char)'\x01'>::
    AuxPtrsFix((AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)__x10_,_(unsigned_char)__x01_>
                *)pAVar5);
    Memory::WriteBarrierPtr<Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>_>::
    operator=(&pFStack_10->auxPtrs,pAVar5);
  }
  else if (recycler._7_1_ == ' ') {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_80,
               (type_info *)
               &AuxPtrsFix<Js::FunctionProxy::AuxPointerType,(unsigned_char)32,(unsigned_char)3>::
                typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/AuxPtrs.h"
               ,0xb3);
    pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_80);
    pAVar5 = (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)
             new<Memory::Recycler>(0x20,pRVar4,0x74bdc0,0);
    ppAVar6 = Memory::WriteBarrierPtr::operator_cast_to_AuxPtrs__
                        ((WriteBarrierPtr *)&pFStack_10->auxPtrs);
    AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)'_',_(unsigned_char)'\x03'>::
    AuxPtrsFix((AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)___,_(unsigned_char)__x03_>
                *)pAVar5,
               (AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)__x10_,_(unsigned_char)__x01_>
                *)*ppAVar6);
    Memory::WriteBarrierPtr<Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>_>::
    operator=(&pFStack_10->auxPtrs,pAVar5);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/AuxPtrs.h"
                                ,0xb7,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void AuxPtrs<T, FieldsEnum>::AllocAuxPtrFix(T* host, uint8 size)
    {
        Recycler* recycler = host->GetRecycler();
        Assert(recycler != nullptr);

        if (size == 16)
        {
            host->auxPtrs = (AuxPtrs<T, FieldsEnum>*)RecyclerNewWithBarrierStructZ(recycler, AuxPtrs16);
        }
        else if (size == 32)
        {
            host->auxPtrs = (AuxPtrs<T, FieldsEnum>*)RecyclerNewWithBarrierPlusZ(recycler, 0, AuxPtrs32, (AuxPtrs16*)(void*)host->auxPtrs);
        }
        else
        {
            Assert(false);
        }
    }